

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O0

void start_pass(j_decompress_ptr cinfo)

{
  int iVar1;
  jpeg_entropy_decoder *pjVar2;
  jpeg_component_info *pjVar3;
  int (*paiVar4) [64];
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var5;
  int local_40;
  int expected;
  int *coef_bit_ptr;
  int cindex;
  int coefi;
  jpeg_component_info *compptr;
  int tbl;
  int ci;
  arith_entropy_ptr_conflict entropy;
  j_decompress_ptr cinfo_local;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->progressive_mode == 0) {
    if ((((cinfo->Ss != 0) || (cinfo->Ah != 0)) || (cinfo->Al != 0)) ||
       ((cinfo->Se < 0x40 && (cinfo->Se != cinfo->lim_Se)))) {
      cinfo->err->msg_code = 0x7d;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
    }
    pjVar2->decode_mcu = decode_mcu;
    goto LAB_00120042;
  }
  if (cinfo->Ss == 0) {
    if (cinfo->Se != 0) goto LAB_0011fd82;
LAB_0011fd49:
    if (((cinfo->Ah != 0) && (cinfo->Ah + -1 != cinfo->Al)) || (0xd < cinfo->Al)) goto LAB_0011fd82;
  }
  else {
    if (((cinfo->Ss <= cinfo->Se) && (cinfo->Se <= cinfo->lim_Se)) && (cinfo->comps_in_scan == 1))
    goto LAB_0011fd49;
LAB_0011fd82:
    cinfo->err->msg_code = 0x11;
    (cinfo->err->msg_parm).i[0] = cinfo->Ss;
    (cinfo->err->msg_parm).i[1] = cinfo->Se;
    (cinfo->err->msg_parm).i[2] = cinfo->Ah;
    (cinfo->err->msg_parm).i[3] = cinfo->Al;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  for (compptr._4_4_ = 0; compptr._4_4_ < cinfo->comps_in_scan; compptr._4_4_ = compptr._4_4_ + 1) {
    iVar1 = cinfo->cur_comp_info[compptr._4_4_]->component_index;
    paiVar4 = cinfo->coef_bits + iVar1;
    if ((cinfo->Ss != 0) && ((*paiVar4)[0] < 0)) {
      cinfo->err->msg_code = 0x76;
      (cinfo->err->msg_parm).i[0] = iVar1;
      (cinfo->err->msg_parm).i[1] = 0;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
    }
    for (coef_bit_ptr._4_4_ = cinfo->Ss; coef_bit_ptr._4_4_ <= cinfo->Se;
        coef_bit_ptr._4_4_ = coef_bit_ptr._4_4_ + 1) {
      if ((*paiVar4)[coef_bit_ptr._4_4_] < 0) {
        local_40 = 0;
      }
      else {
        local_40 = (*paiVar4)[coef_bit_ptr._4_4_];
      }
      if (cinfo->Ah != local_40) {
        cinfo->err->msg_code = 0x76;
        (cinfo->err->msg_parm).i[0] = iVar1;
        (cinfo->err->msg_parm).i[1] = coef_bit_ptr._4_4_;
        (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
      }
      (*paiVar4)[coef_bit_ptr._4_4_] = cinfo->Al;
    }
  }
  if (cinfo->Ah == 0) {
    if (cinfo->Ss == 0) {
      pjVar2->decode_mcu = decode_mcu_DC_first;
    }
    else {
      pjVar2->decode_mcu = decode_mcu_AC_first;
    }
  }
  else if (cinfo->Ss == 0) {
    pjVar2->decode_mcu = decode_mcu_DC_refine;
  }
  else {
    pjVar2->decode_mcu = decode_mcu_AC_refine;
  }
LAB_00120042:
  for (compptr._4_4_ = 0; compptr._4_4_ < cinfo->comps_in_scan; compptr._4_4_ = compptr._4_4_ + 1) {
    pjVar3 = cinfo->cur_comp_info[compptr._4_4_];
    if ((cinfo->progressive_mode == 0) || ((cinfo->Ss == 0 && (cinfo->Ah == 0)))) {
      iVar1 = pjVar3->dc_tbl_no;
      if ((iVar1 < 0) || (0xf < iVar1)) {
        cinfo->err->msg_code = 0x32;
        (cinfo->err->msg_parm).i[0] = iVar1;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
      if ((&pjVar2[4].decode_mcu)[iVar1] == (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)0x0) {
        p_Var5 = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)
                 (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x40);
        (&pjVar2[4].decode_mcu)[iVar1] = p_Var5;
      }
      memset((&pjVar2[4].decode_mcu)[iVar1],0,0x40);
      *(undefined4 *)((long)&pjVar2[2].start_pass + (long)compptr._4_4_ * 4 + 4) = 0;
      *(undefined4 *)((long)&pjVar2[3].start_pass + (long)compptr._4_4_ * 4 + 4) = 0;
    }
    if (((cinfo->progressive_mode == 0) && (cinfo->lim_Se != 0)) ||
       ((cinfo->progressive_mode != 0 && (cinfo->Ss != 0)))) {
      iVar1 = pjVar3->ac_tbl_no;
      if ((iVar1 < 0) || (0xf < iVar1)) {
        cinfo->err->msg_code = 0x32;
        (cinfo->err->msg_parm).i[0] = iVar1;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
      if ((&pjVar2[0xc].decode_mcu)[iVar1] == (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)0x0) {
        p_Var5 = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)
                 (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x100);
        (&pjVar2[0xc].decode_mcu)[iVar1] = p_Var5;
      }
      memset((&pjVar2[0xc].decode_mcu)[iVar1],0,0x100);
    }
  }
  pjVar2[1].start_pass = (_func_void_j_decompress_ptr *)0x0;
  pjVar2[1].decode_mcu = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)0x0;
  *(undefined4 *)&pjVar2[2].start_pass = 0xfffffff0;
  *(uint *)((long)&pjVar2[4].start_pass + 4) = cinfo->restart_interval;
  return;
}

Assistant:

METHODDEF(void)
start_pass (j_compress_ptr cinfo, boolean gather_statistics)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  int ci, tbl;
  jpeg_component_info * compptr;

  if (gather_statistics)
    /* Make sure to avoid that in the master control logic!
     * We are fully adaptive here and need no extra
     * statistics gathering pass!
     */
    ERREXIT(cinfo, JERR_NOT_COMPILED);

  /* We assume jcmaster.c already validated the progressive scan parameters. */

  /* Select execution routines */
  if (cinfo->progressive_mode) {
    if (cinfo->Ah == 0) {
      if (cinfo->Ss == 0)
	entropy->pub.encode_mcu = encode_mcu_DC_first;
      else
	entropy->pub.encode_mcu = encode_mcu_AC_first;
    } else {
      if (cinfo->Ss == 0)
	entropy->pub.encode_mcu = encode_mcu_DC_refine;
      else
	entropy->pub.encode_mcu = encode_mcu_AC_refine;
    }
  } else
    entropy->pub.encode_mcu = encode_mcu;

  /* Allocate & initialize requested statistics areas */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    /* DC needs no table for refinement scan */
    if (cinfo->Ss == 0 && cinfo->Ah == 0) {
      tbl = compptr->dc_tbl_no;
      if (tbl < 0 || tbl >= NUM_ARITH_TBLS)
	ERREXIT1(cinfo, JERR_NO_ARITH_TABLE, tbl);
      if (entropy->dc_stats[tbl] == NULL)
	entropy->dc_stats[tbl] = (unsigned char *) (*cinfo->mem->alloc_small)
	  ((j_common_ptr) cinfo, JPOOL_IMAGE, DC_STAT_BINS);
      MEMZERO(entropy->dc_stats[tbl], DC_STAT_BINS);
      /* Initialize DC predictions to 0 */
      entropy->last_dc_val[ci] = 0;
      entropy->dc_context[ci] = 0;
    }
    /* AC needs no table when not present */
    if (cinfo->Se) {
      tbl = compptr->ac_tbl_no;
      if (tbl < 0 || tbl >= NUM_ARITH_TBLS)
	ERREXIT1(cinfo, JERR_NO_ARITH_TABLE, tbl);
      if (entropy->ac_stats[tbl] == NULL)
	entropy->ac_stats[tbl] = (unsigned char *) (*cinfo->mem->alloc_small)
	  ((j_common_ptr) cinfo, JPOOL_IMAGE, AC_STAT_BINS);
      MEMZERO(entropy->ac_stats[tbl], AC_STAT_BINS);
#ifdef CALCULATE_SPECTRAL_CONDITIONING
      if (cinfo->progressive_mode)
	/* Section G.1.3.2: Set appropriate arithmetic conditioning value Kx */
	cinfo->arith_ac_K[tbl] = cinfo->Ss + ((8 + cinfo->Se - cinfo->Ss) >> 4);
#endif
    }
  }

  /* Initialize arithmetic encoding variables */
  entropy->c = 0;
  entropy->a = 0x10000L;
  entropy->sc = 0;
  entropy->zc = 0;
  entropy->ct = 11;
  entropy->buffer = -1;  /* empty */

  /* Initialize restart stuff */
  entropy->restarts_to_go = cinfo->restart_interval;
  entropy->next_restart_num = 0;
}